

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  size_t k;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  vbool<4> vVar29;
  uint uVar30;
  int iVar31;
  undefined4 uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  uint uVar36;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar37;
  ulong uVar38;
  NodeRef *pNVar39;
  bool bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_ZMM0 [64];
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar74;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  undefined1 auVar71 [64];
  float fVar75;
  float fVar89;
  float fVar90;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar92;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar91;
  float fVar93;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar119;
  float fVar120;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar127;
  float fVar133;
  float fVar135;
  undefined1 auVar128 [16];
  float fVar137;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar136;
  float fVar138;
  undefined1 auVar132 [16];
  float fVar139;
  float fVar140;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [64];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [64];
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  float fVar169;
  undefined1 auVar163 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar170;
  undefined1 auVar164 [64];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar178;
  float fVar182;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  float fVar181;
  float fVar183;
  undefined1 auVar180 [64];
  Precalculations pre;
  vbool<4> terminated;
  undefined8 uStack_37c0;
  float local_37b8;
  float fStack_37b4;
  float fStack_37b0;
  float local_37a8;
  float fStack_37a4;
  float fStack_37a0;
  undefined1 local_3798 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_3658 [16];
  undefined1 local_3648 [16];
  undefined1 local_3638 [16];
  undefined1 local_3628 [16];
  undefined1 local_3618 [16];
  undefined1 local_3608 [8];
  float fStack_3600;
  float fStack_35fc;
  undefined8 local_35f8;
  undefined8 uStack_35f0;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  uint local_34f8;
  uint uStack_34f4;
  uint uStack_34f0;
  uint uStack_34ec;
  uint uStack_34e8;
  uint uStack_34e4;
  uint uStack_34e0;
  uint uStack_34dc;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar101 [64];
  undefined1 auVar145 [16];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar88 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar94 = vpcmpeqd_avx(auVar88,(undefined1  [16])valid_i->field_0);
    auVar66 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar66,5);
    auVar54 = auVar94 & auVar11;
    if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar54[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar94);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar67._8_4_ = 0x7fffffff;
      auVar67._0_8_ = 0x7fffffff7fffffff;
      auVar67._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar141._8_4_ = 0x219392ef;
      auVar141._0_8_ = 0x219392ef219392ef;
      auVar141._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar94,auVar141,1);
      auVar158._8_4_ = 0x3f800000;
      auVar158._0_8_ = &DAT_3f8000003f800000;
      auVar158._12_4_ = 0x3f800000;
      auVar113 = vdivps_avx(auVar158,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar94 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar69 = vcmpps_avx(auVar94,auVar141,1);
      auVar114 = vdivps_avx(auVar158,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar94 = vandps_avx(auVar67,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar94 = vcmpps_avx(auVar94,auVar141,1);
      auVar142._8_4_ = 0x5d5e0b6b;
      auVar142._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar142._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar113,auVar142,auVar54)
      ;
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar114,auVar142,auVar69)
      ;
      auVar54 = vdivps_avx(auVar158,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar54,auVar142,auVar94);
      auVar94 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar66,1);
      auVar113._8_4_ = 0x20;
      auVar113._0_8_ = 0x2000000020;
      auVar113._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar94,auVar113);
      auVar94 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar66,5);
      auVar54._8_4_ = 0x40;
      auVar54._0_8_ = 0x4000000040;
      auVar54._12_4_ = 0x40;
      auVar114._8_4_ = 0x60;
      auVar114._0_8_ = 0x6000000060;
      auVar114._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar114,auVar54,auVar94)
      ;
      auVar94 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar66,5);
      auVar69._8_4_ = 0x80;
      auVar69._0_8_ = 0x8000000080;
      auVar69._12_4_ = 0x80;
      auVar115._8_4_ = 0xa0;
      auVar115._0_8_ = 0xa0000000a0;
      auVar115._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar115,auVar69,auVar94)
      ;
      auVar94 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar66);
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar66);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar159 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar94,auVar11);
      auVar71 = ZEXT1664((undefined1  [16])tray.tnear.field_0);
      auVar94._8_4_ = 0xff800000;
      auVar94._0_8_ = 0xff800000ff800000;
      auVar94._12_4_ = 0xff800000;
      auVar101 = ZEXT1664(auVar94);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar94,auVar54,auVar11);
      terminated.field_0._0_4_ = auVar11._0_4_ ^ auVar88._0_4_;
      terminated.field_0._4_4_ = auVar11._4_4_ ^ auVar88._4_4_;
      terminated.field_0._8_4_ = auVar11._8_4_ ^ auVar88._8_4_;
      terminated.field_0._12_4_ = auVar11._12_4_ ^ auVar88._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar39 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar37 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar153 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar164 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
LAB_004121cf:
      paVar37 = paVar37 + -1;
      root.ptr = pNVar39[-1].ptr;
      pNVar39 = pNVar39 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00412cb7;
      aVar178 = *paVar37;
      auVar88 = vcmpps_avx((undefined1  [16])aVar178,(undefined1  [16])tray.tfar.field_0,1);
      uVar30 = vmovmskps_avx(auVar88);
      if (uVar30 == 0) {
LAB_00412cc8:
        iVar31 = 2;
      }
      else {
        uVar38 = (ulong)(uVar30 & 0xff);
        uVar30 = POPCOUNT(uVar30 & 0xff);
        iVar31 = 0;
        if (uVar30 <= uVar36) {
          do {
            k = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar71 = ZEXT1664(auVar71._0_16_);
            auVar101 = ZEXT1664(auVar101._0_16_);
            bVar40 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar40) {
              terminated.field_0.i[k] = -1;
            }
            uVar38 = uVar38 & uVar38 - 1;
          } while (uVar38 != 0);
          auVar88 = vpcmpeqd_avx(auVar71._0_16_,auVar71._0_16_);
          auVar71 = ZEXT1664(auVar88);
          auVar88 = auVar88 & ~(undefined1  [16])terminated.field_0;
          iVar31 = 3;
          auVar159 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          auVar153 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
          auVar164 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
          if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar88[0xf] < '\0') {
            auVar71 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
            auVar88._8_4_ = 0xff800000;
            auVar88._0_8_ = 0xff800000ff800000;
            auVar88._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar88,
                               (undefined1  [16])terminated.field_0);
            iVar31 = 2;
          }
        }
        vVar29.field_0 = terminated.field_0;
        if (uVar36 < uVar30) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00412cb7;
              auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar178,6);
              if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar88[0xf]) goto LAB_00412cc8;
              uVar38 = (ulong)((uint)root.ptr & 0xf);
              auVar88 = vpcmpeqd_avx(auVar101._0_16_,auVar101._0_16_);
              auVar101 = ZEXT1664(auVar88);
              if (uVar38 == 8) goto LAB_00412c81;
              lVar35 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar33 = 0;
              auVar88 = (undefined1  [16])terminated.field_0 ^ auVar88;
              goto LAB_00412420;
            }
            auVar180 = ZEXT1664(auVar159._0_16_);
            uVar38 = 0;
            uVar33 = 8;
            do {
              uVar34 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar38 * 8);
              if (uVar34 != 8) {
                uVar32 = *(undefined4 *)(root.ptr + 0x40 + uVar38 * 4);
                auVar41._4_4_ = uVar32;
                auVar41._0_4_ = uVar32;
                auVar41._8_4_ = uVar32;
                auVar41._12_4_ = uVar32;
                auVar24._8_8_ = tray.org.field_0._8_8_;
                auVar24._0_8_ = tray.org.field_0._0_8_;
                auVar25._8_8_ = tray.org.field_0._24_8_;
                auVar25._0_8_ = tray.org.field_0._16_8_;
                auVar26._8_8_ = tray.org.field_0._40_8_;
                auVar26._0_8_ = tray.org.field_0._32_8_;
                auVar88 = vsubps_avx(auVar41,auVar24);
                auVar106._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar88._0_4_;
                auVar106._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar88._4_4_;
                auVar106._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar88._8_4_;
                auVar106._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar88._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x80 + uVar38 * 4);
                auVar42._4_4_ = uVar32;
                auVar42._0_4_ = uVar32;
                auVar42._8_4_ = uVar32;
                auVar42._12_4_ = uVar32;
                auVar88 = vsubps_avx(auVar42,auVar25);
                auVar122._0_4_ = tray.rdir.field_0._16_4_ * auVar88._0_4_;
                auVar122._4_4_ = tray.rdir.field_0._20_4_ * auVar88._4_4_;
                auVar122._8_4_ = tray.rdir.field_0._24_4_ * auVar88._8_4_;
                auVar122._12_4_ = tray.rdir.field_0._28_4_ * auVar88._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xc0 + uVar38 * 4);
                auVar43._4_4_ = uVar32;
                auVar43._0_4_ = uVar32;
                auVar43._8_4_ = uVar32;
                auVar43._12_4_ = uVar32;
                auVar88 = vsubps_avx(auVar43,auVar26);
                auVar143._0_4_ = tray.rdir.field_0._32_4_ * auVar88._0_4_;
                auVar143._4_4_ = tray.rdir.field_0._36_4_ * auVar88._4_4_;
                auVar143._8_4_ = tray.rdir.field_0._40_4_ * auVar88._8_4_;
                auVar143._12_4_ = tray.rdir.field_0._44_4_ * auVar88._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0x60 + uVar38 * 4);
                auVar44._4_4_ = uVar32;
                auVar44._0_4_ = uVar32;
                auVar44._8_4_ = uVar32;
                auVar44._12_4_ = uVar32;
                auVar88 = vsubps_avx(auVar44,auVar24);
                auVar57._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar88._0_4_;
                auVar57._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar88._4_4_;
                auVar57._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar88._8_4_;
                auVar57._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar88._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xa0 + uVar38 * 4);
                auVar45._4_4_ = uVar32;
                auVar45._0_4_ = uVar32;
                auVar45._8_4_ = uVar32;
                auVar45._12_4_ = uVar32;
                auVar88 = vsubps_avx(auVar45,auVar25);
                auVar76._0_4_ = tray.rdir.field_0._16_4_ * auVar88._0_4_;
                auVar76._4_4_ = tray.rdir.field_0._20_4_ * auVar88._4_4_;
                auVar76._8_4_ = tray.rdir.field_0._24_4_ * auVar88._8_4_;
                auVar76._12_4_ = tray.rdir.field_0._28_4_ * auVar88._12_4_;
                uVar32 = *(undefined4 *)(root.ptr + 0xe0 + uVar38 * 4);
                auVar46._4_4_ = uVar32;
                auVar46._0_4_ = uVar32;
                auVar46._8_4_ = uVar32;
                auVar46._12_4_ = uVar32;
                auVar88 = vsubps_avx(auVar46,auVar26);
                auVar95._0_4_ = tray.rdir.field_0._32_4_ * auVar88._0_4_;
                auVar95._4_4_ = tray.rdir.field_0._36_4_ * auVar88._4_4_;
                auVar95._8_4_ = tray.rdir.field_0._40_4_ * auVar88._8_4_;
                auVar95._12_4_ = tray.rdir.field_0._44_4_ * auVar88._12_4_;
                auVar101 = ZEXT1664(auVar95);
                auVar88 = vminps_avx(auVar106,auVar57);
                auVar94 = vminps_avx(auVar122,auVar76);
                auVar88 = vmaxps_avx(auVar88,auVar94);
                auVar94 = vminps_avx(auVar143,auVar95);
                auVar88 = vmaxps_avx(auVar88,auVar94);
                auVar47._0_4_ = auVar153._0_4_ * auVar88._0_4_;
                auVar47._4_4_ = auVar153._4_4_ * auVar88._4_4_;
                auVar47._8_4_ = auVar153._8_4_ * auVar88._8_4_;
                auVar47._12_4_ = auVar153._12_4_ * auVar88._12_4_;
                auVar88 = vmaxps_avx(auVar106,auVar57);
                auVar94 = vmaxps_avx(auVar122,auVar76);
                auVar94 = vminps_avx(auVar88,auVar94);
                auVar88 = vmaxps_avx(auVar143,auVar95);
                auVar88 = vminps_avx(auVar94,auVar88);
                auVar58._0_4_ = auVar164._0_4_ * auVar88._0_4_;
                auVar58._4_4_ = auVar164._4_4_ * auVar88._4_4_;
                auVar58._8_4_ = auVar164._8_4_ * auVar88._8_4_;
                auVar58._12_4_ = auVar164._12_4_ * auVar88._12_4_;
                auVar88 = vmaxps_avx(auVar47,(undefined1  [16])tray.tnear.field_0);
                auVar94 = vminps_avx(auVar58,(undefined1  [16])tray.tfar.field_0);
                auVar88 = vcmpps_avx(auVar88,auVar94,2);
                auVar71 = ZEXT1664(auVar88);
                if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar88[0xf] < '\0') {
                  auVar88 = vblendvps_avx(auVar159._0_16_,auVar47,auVar88);
                  if (uVar33 != 8) {
                    pNVar39->ptr = uVar33;
                    pNVar39 = pNVar39 + 1;
                    *paVar37 = auVar180._0_16_;
                    paVar37 = paVar37 + 1;
                  }
                  auVar180 = ZEXT1664(auVar88);
                  uVar33 = uVar34;
                }
              }
              aVar178 = auVar180._0_16_;
            } while ((uVar34 != 8) && (bVar40 = uVar38 < 7, uVar38 = uVar38 + 1, bVar40));
            iVar31 = 0;
            if (uVar33 == 8) {
LAB_004123bd:
              bVar40 = false;
              iVar31 = 4;
            }
            else {
              auVar88 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar178,6);
              uVar32 = vmovmskps_avx(auVar88);
              bVar40 = true;
              if ((uint)POPCOUNT(uVar32) <= uVar36) {
                pNVar39->ptr = uVar33;
                pNVar39 = pNVar39 + 1;
                *paVar37 = aVar178;
                paVar37 = paVar37 + 1;
                goto LAB_004123bd;
              }
            }
            root.ptr = uVar33;
          } while (bVar40);
        }
      }
      goto LAB_00412cba;
    }
  }
  return;
  while( true ) {
    uVar33 = uVar33 + 1;
    lVar35 = lVar35 + 0xb0;
    auVar88 = auVar54;
    if (uVar38 - 8 <= uVar33) break;
LAB_00412420:
    uVar34 = 0;
    auVar94 = auVar88;
    while( true ) {
      uVar30 = *(uint *)(lVar35 + -0x10 + uVar34 * 4);
      if ((ulong)uVar30 == 0xffffffff) break;
      uVar32 = *(undefined4 *)(lVar35 + -0xa0 + uVar34 * 4);
      auVar48._4_4_ = uVar32;
      auVar48._0_4_ = uVar32;
      auVar48._8_4_ = uVar32;
      auVar48._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x90 + uVar34 * 4);
      auVar59._4_4_ = uVar32;
      auVar59._0_4_ = uVar32;
      auVar59._8_4_ = uVar32;
      auVar59._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x80 + uVar34 * 4);
      auVar77._4_4_ = uVar32;
      auVar77._0_4_ = uVar32;
      auVar77._8_4_ = uVar32;
      auVar77._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x70 + uVar34 * 4);
      auVar96._4_4_ = uVar32;
      auVar96._0_4_ = uVar32;
      auVar96._8_4_ = uVar32;
      auVar96._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x60 + uVar34 * 4);
      auVar102._4_4_ = uVar32;
      auVar102._0_4_ = uVar32;
      auVar102._8_4_ = uVar32;
      auVar102._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x50 + uVar34 * 4);
      auVar107._4_4_ = uVar32;
      auVar107._0_4_ = uVar32;
      auVar107._8_4_ = uVar32;
      auVar107._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x40 + uVar34 * 4);
      auVar116._4_4_ = uVar32;
      auVar116._0_4_ = uVar32;
      auVar116._8_4_ = uVar32;
      auVar116._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x30 + uVar34 * 4);
      auVar162._4_4_ = uVar32;
      auVar162._0_4_ = uVar32;
      auVar162._8_4_ = uVar32;
      auVar162._12_4_ = uVar32;
      uVar32 = *(undefined4 *)(lVar35 + -0x20 + uVar34 * 4);
      auVar128._4_4_ = uVar32;
      auVar128._0_4_ = uVar32;
      auVar128._8_4_ = uVar32;
      auVar128._12_4_ = uVar32;
      auVar54 = *(undefined1 (*) [16])ray;
      auVar66 = *(undefined1 (*) [16])(ray + 0x10);
      auVar69 = *(undefined1 (*) [16])(ray + 0x20);
      auVar113 = vsubps_avx(auVar48,auVar54);
      auVar114 = vsubps_avx(auVar59,auVar66);
      auVar115 = vsubps_avx(auVar77,auVar69);
      auVar67 = vsubps_avx(auVar96,auVar54);
      auVar141 = vsubps_avx(auVar102,auVar66);
      auVar142 = vsubps_avx(auVar107,auVar69);
      auVar158 = vsubps_avx(auVar116,auVar54);
      auVar66 = vsubps_avx(auVar162,auVar66);
      auVar69 = vsubps_avx(auVar128,auVar69);
      auVar54 = vsubps_avx(auVar158,auVar113);
      auVar48 = vsubps_avx(auVar66,auVar114);
      auVar49 = vsubps_avx(auVar69,auVar115);
      fVar175 = auVar114._0_4_;
      fVar112 = fVar175 + auVar66._0_4_;
      fVar181 = auVar114._4_4_;
      fVar119 = fVar181 + auVar66._4_4_;
      fVar183 = auVar114._8_4_;
      fVar120 = fVar183 + auVar66._8_4_;
      fVar185 = auVar114._12_4_;
      fVar121 = fVar185 + auVar66._12_4_;
      fVar5 = auVar115._0_4_;
      fVar126 = auVar69._0_4_ + fVar5;
      fVar7 = auVar115._4_4_;
      fVar133 = auVar69._4_4_ + fVar7;
      fVar91 = auVar115._8_4_;
      fVar135 = auVar69._8_4_ + fVar91;
      fVar9 = auVar115._12_4_;
      fVar137 = auVar69._12_4_ + fVar9;
      fVar56 = auVar49._0_4_;
      auVar144._0_4_ = fVar112 * fVar56;
      fVar12 = auVar49._4_4_;
      auVar144._4_4_ = fVar119 * fVar12;
      fVar13 = auVar49._8_4_;
      auVar144._8_4_ = fVar120 * fVar13;
      fVar14 = auVar49._12_4_;
      auVar144._12_4_ = fVar121 * fVar14;
      fVar171 = auVar48._0_4_;
      auVar151._0_4_ = fVar171 * fVar126;
      fVar172 = auVar48._4_4_;
      auVar151._4_4_ = fVar172 * fVar133;
      fVar173 = auVar48._8_4_;
      auVar151._8_4_ = fVar173 * fVar135;
      fVar174 = auVar48._12_4_;
      auVar151._12_4_ = fVar174 * fVar137;
      auVar48 = vsubps_avx(auVar151,auVar144);
      fVar6 = auVar113._0_4_;
      fVar139 = auVar158._0_4_ + fVar6;
      fVar8 = auVar113._4_4_;
      fVar146 = auVar158._4_4_ + fVar8;
      fVar93 = auVar113._8_4_;
      fVar148 = auVar158._8_4_ + fVar93;
      fVar10 = auVar113._12_4_;
      fVar149 = auVar158._12_4_ + fVar10;
      fVar160 = auVar54._0_4_;
      auVar129._0_4_ = fVar160 * fVar126;
      fVar165 = auVar54._4_4_;
      auVar129._4_4_ = fVar165 * fVar133;
      fVar167 = auVar54._8_4_;
      auVar129._8_4_ = fVar167 * fVar135;
      fVar169 = auVar54._12_4_;
      auVar129._12_4_ = fVar169 * fVar137;
      auVar152._0_4_ = fVar139 * fVar56;
      auVar152._4_4_ = fVar146 * fVar12;
      auVar152._8_4_ = fVar148 * fVar13;
      auVar152._12_4_ = fVar149 * fVar14;
      auVar49 = vsubps_avx(auVar152,auVar129);
      auVar130._0_4_ = fVar139 * fVar171;
      auVar130._4_4_ = fVar146 * fVar172;
      auVar130._8_4_ = fVar148 * fVar173;
      auVar130._12_4_ = fVar149 * fVar174;
      auVar117._0_4_ = fVar160 * fVar112;
      auVar117._4_4_ = fVar165 * fVar119;
      auVar117._8_4_ = fVar167 * fVar120;
      auVar117._12_4_ = fVar169 * fVar121;
      auVar50 = vsubps_avx(auVar117,auVar130);
      auVar54 = *(undefined1 (*) [16])(ray + 0x60);
      fVar112 = auVar54._0_4_;
      fVar121 = auVar54._4_4_;
      fVar135 = auVar54._8_4_;
      fVar146 = auVar54._12_4_;
      fVar16 = *(float *)(ray + 0x50);
      fVar17 = *(float *)(ray + 0x54);
      fVar18 = *(float *)(ray + 0x58);
      auVar27 = *(undefined1 (*) [12])(ray + 0x50);
      fVar19 = *(float *)(ray + 0x5c);
      fVar20 = *(float *)(ray + 0x40);
      fVar21 = *(float *)(ray + 0x44);
      fVar22 = *(float *)(ray + 0x48);
      auVar28 = *(undefined1 (*) [12])(ray + 0x40);
      fVar23 = *(float *)(ray + 0x4c);
      fVar140 = fVar20 * auVar48._0_4_ + fVar16 * auVar49._0_4_ + auVar50._0_4_ * fVar112;
      fVar147 = fVar21 * auVar48._4_4_ + fVar17 * auVar49._4_4_ + auVar50._4_4_ * fVar121;
      auVar145._0_8_ = CONCAT44(fVar147,fVar140);
      auVar145._8_4_ = fVar22 * auVar48._8_4_ + fVar18 * auVar49._8_4_ + auVar50._8_4_ * fVar135;
      auVar145._12_4_ = fVar23 * auVar48._12_4_ + fVar19 * auVar49._12_4_ + auVar50._12_4_ * fVar146
      ;
      auVar54 = vsubps_avx(auVar114,auVar141);
      auVar114 = vsubps_avx(auVar115,auVar142);
      fVar120 = fVar175 + auVar141._0_4_;
      fVar133 = fVar181 + auVar141._4_4_;
      fVar139 = fVar183 + auVar141._8_4_;
      fVar149 = fVar185 + auVar141._12_4_;
      fVar176 = auVar142._0_4_ + fVar5;
      fVar182 = auVar142._4_4_ + fVar7;
      fVar184 = auVar142._8_4_ + fVar91;
      fVar186 = auVar142._12_4_ + fVar9;
      fVar150 = auVar114._0_4_;
      auVar163._0_4_ = fVar150 * fVar120;
      fVar154 = auVar114._4_4_;
      auVar163._4_4_ = fVar154 * fVar133;
      fVar155 = auVar114._8_4_;
      auVar163._8_4_ = fVar155 * fVar139;
      fVar156 = auVar114._12_4_;
      auVar163._12_4_ = fVar156 * fVar149;
      fVar119 = auVar54._0_4_;
      auVar78._0_4_ = fVar176 * fVar119;
      fVar126 = auVar54._4_4_;
      auVar78._4_4_ = fVar182 * fVar126;
      fVar137 = auVar54._8_4_;
      auVar78._8_4_ = fVar184 * fVar137;
      fVar148 = auVar54._12_4_;
      auVar78._12_4_ = fVar186 * fVar148;
      auVar54 = vsubps_avx(auVar78,auVar163);
      auVar113 = vsubps_avx(auVar113,auVar67);
      fVar161 = auVar113._0_4_;
      auVar179._0_4_ = fVar161 * fVar176;
      fVar166 = auVar113._4_4_;
      auVar179._4_4_ = fVar166 * fVar182;
      fVar168 = auVar113._8_4_;
      auVar179._8_4_ = fVar168 * fVar184;
      fVar170 = auVar113._12_4_;
      auVar179._12_4_ = fVar170 * fVar186;
      fVar176 = fVar6 + auVar67._0_4_;
      fVar182 = fVar8 + auVar67._4_4_;
      fVar184 = fVar93 + auVar67._8_4_;
      fVar186 = fVar10 + auVar67._12_4_;
      auVar131._0_4_ = fVar150 * fVar176;
      auVar131._4_4_ = fVar154 * fVar182;
      auVar131._8_4_ = fVar155 * fVar184;
      auVar131._12_4_ = fVar156 * fVar186;
      auVar113 = vsubps_avx(auVar131,auVar179);
      auVar123._0_4_ = fVar176 * fVar119;
      auVar123._4_4_ = fVar182 * fVar126;
      auVar123._8_4_ = fVar184 * fVar137;
      auVar123._12_4_ = fVar186 * fVar148;
      auVar118._0_4_ = fVar161 * fVar120;
      auVar118._4_4_ = fVar166 * fVar133;
      auVar118._8_4_ = fVar168 * fVar139;
      auVar118._12_4_ = fVar170 * fVar149;
      auVar114 = vsubps_avx(auVar118,auVar123);
      auVar124._0_4_ = fVar20 * auVar54._0_4_ + auVar114._0_4_ * fVar112 + fVar16 * auVar113._0_4_;
      auVar124._4_4_ = fVar21 * auVar54._4_4_ + auVar114._4_4_ * fVar121 + fVar17 * auVar113._4_4_;
      auVar124._8_4_ = fVar22 * auVar54._8_4_ + auVar114._8_4_ * fVar135 + fVar18 * auVar113._8_4_;
      auVar124._12_4_ =
           fVar23 * auVar54._12_4_ + auVar114._12_4_ * fVar146 + fVar19 * auVar113._12_4_;
      auVar54 = vsubps_avx(auVar67,auVar158);
      fVar55 = auVar67._0_4_ + auVar158._0_4_;
      fVar72 = auVar67._4_4_ + auVar158._4_4_;
      fVar73 = auVar67._8_4_ + auVar158._8_4_;
      fVar74 = auVar67._12_4_ + auVar158._12_4_;
      auVar113 = vsubps_avx(auVar141,auVar66);
      fVar176 = auVar141._0_4_ + auVar66._0_4_;
      fVar182 = auVar141._4_4_ + auVar66._4_4_;
      fVar184 = auVar141._8_4_ + auVar66._8_4_;
      fVar186 = auVar141._12_4_ + auVar66._12_4_;
      auVar66 = vsubps_avx(auVar142,auVar69);
      fVar75 = auVar142._0_4_ + auVar69._0_4_;
      fVar89 = auVar142._4_4_ + auVar69._4_4_;
      fVar90 = auVar142._8_4_ + auVar69._8_4_;
      fVar92 = auVar142._12_4_ + auVar69._12_4_;
      fVar120 = auVar66._0_4_;
      auVar97._0_4_ = fVar176 * fVar120;
      fVar133 = auVar66._4_4_;
      auVar97._4_4_ = fVar182 * fVar133;
      fVar139 = auVar66._8_4_;
      auVar97._8_4_ = fVar184 * fVar139;
      fVar149 = auVar66._12_4_;
      auVar97._12_4_ = fVar186 * fVar149;
      fVar127 = auVar113._0_4_;
      auVar108._0_4_ = fVar127 * fVar75;
      fVar134 = auVar113._4_4_;
      auVar108._4_4_ = fVar134 * fVar89;
      fVar136 = auVar113._8_4_;
      auVar108._8_4_ = fVar136 * fVar90;
      fVar138 = auVar113._12_4_;
      auVar108._12_4_ = fVar138 * fVar92;
      auVar66 = vsubps_avx(auVar108,auVar97);
      fVar177 = auVar54._0_4_;
      auVar79._0_4_ = fVar177 * fVar75;
      fVar75 = auVar54._4_4_;
      auVar79._4_4_ = fVar75 * fVar89;
      fVar89 = auVar54._8_4_;
      auVar79._8_4_ = fVar89 * fVar90;
      fVar90 = auVar54._12_4_;
      auVar79._12_4_ = fVar90 * fVar92;
      auVar109._0_4_ = fVar55 * fVar120;
      auVar109._4_4_ = fVar72 * fVar133;
      auVar109._8_4_ = fVar73 * fVar139;
      auVar109._12_4_ = fVar74 * fVar149;
      auVar54 = vsubps_avx(auVar109,auVar79);
      auVar110._8_4_ = 0x7fffffff;
      auVar110._0_8_ = 0x7fffffff7fffffff;
      auVar110._12_4_ = 0x7fffffff;
      auVar60._0_4_ = fVar127 * fVar55;
      auVar60._4_4_ = fVar134 * fVar72;
      auVar60._8_4_ = fVar136 * fVar73;
      auVar60._12_4_ = fVar138 * fVar74;
      auVar49._0_4_ = fVar177 * fVar176;
      auVar49._4_4_ = fVar75 * fVar182;
      auVar49._8_4_ = fVar89 * fVar184;
      auVar49._12_4_ = fVar90 * fVar186;
      auVar69 = vsubps_avx(auVar49,auVar60);
      auVar50._0_4_ = fVar20 * auVar66._0_4_ + auVar69._0_4_ * fVar112 + fVar16 * auVar54._0_4_;
      auVar50._4_4_ = fVar21 * auVar66._4_4_ + auVar69._4_4_ * fVar121 + fVar17 * auVar54._4_4_;
      auVar50._8_4_ = fVar22 * auVar66._8_4_ + auVar69._8_4_ * fVar135 + fVar18 * auVar54._8_4_;
      auVar50._12_4_ = fVar23 * auVar66._12_4_ + auVar69._12_4_ * fVar146 + fVar19 * auVar54._12_4_;
      auVar157._0_4_ = auVar50._0_4_ + fVar140 + auVar124._0_4_;
      auVar157._4_4_ = auVar50._4_4_ + fVar147 + auVar124._4_4_;
      auVar157._8_4_ = auVar50._8_4_ + auVar145._8_4_ + auVar124._8_4_;
      auVar157._12_4_ = auVar50._12_4_ + auVar145._12_4_ + auVar124._12_4_;
      auVar54 = vandps_avx(auVar157,auVar110);
      auVar61._0_4_ = auVar54._0_4_ * 1.1920929e-07;
      auVar61._4_4_ = auVar54._4_4_ * 1.1920929e-07;
      auVar61._8_4_ = auVar54._8_4_ * 1.1920929e-07;
      auVar61._12_4_ = auVar54._12_4_ * 1.1920929e-07;
      auVar54 = vminps_avx(auVar145,auVar124);
      auVar54 = vminps_avx(auVar54,auVar50);
      uVar15 = CONCAT44(auVar61._4_4_,auVar61._0_4_);
      auVar66._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar66._8_4_ = -auVar61._8_4_;
      auVar66._12_4_ = -auVar61._12_4_;
      auVar54 = vcmpps_avx(auVar54,auVar66,5);
      auVar69 = vmaxps_avx(auVar145,auVar124);
      auVar66 = vmaxps_avx(auVar69,auVar50);
      auVar66 = vcmpps_avx(auVar66,auVar61,2);
      auVar54 = vorps_avx(auVar54,auVar66);
      auVar66 = auVar94 & auVar54;
      auVar54 = vandps_avx(auVar54,auVar94);
      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf])
      {
        auVar66 = vpcmpeqd_avx(auVar69,auVar69);
        auVar69 = ZEXT416(0) << 0x20;
      }
      else {
        auVar51._0_4_ = fVar119 * fVar56;
        auVar51._4_4_ = fVar126 * fVar12;
        auVar51._8_4_ = fVar137 * fVar13;
        auVar51._12_4_ = fVar148 * fVar14;
        auVar62._0_4_ = fVar171 * fVar150;
        auVar62._4_4_ = fVar172 * fVar154;
        auVar62._8_4_ = fVar173 * fVar155;
        auVar62._12_4_ = fVar174 * fVar156;
        auVar113 = vsubps_avx(auVar62,auVar51);
        auVar80._0_4_ = fVar127 * fVar150;
        auVar80._4_4_ = fVar134 * fVar154;
        auVar80._8_4_ = fVar136 * fVar155;
        auVar80._12_4_ = fVar138 * fVar156;
        auVar98._0_4_ = fVar119 * fVar120;
        auVar98._4_4_ = fVar126 * fVar133;
        auVar98._8_4_ = fVar137 * fVar139;
        auVar98._12_4_ = fVar148 * fVar149;
        auVar114 = vsubps_avx(auVar98,auVar80);
        auVar66 = vandps_avx(auVar51,auVar110);
        auVar69 = vandps_avx(auVar80,auVar110);
        auVar66 = vcmpps_avx(auVar66,auVar69,1);
        auVar113 = vblendvps_avx(auVar114,auVar113,auVar66);
        auVar52._0_4_ = fVar161 * fVar120;
        auVar52._4_4_ = fVar166 * fVar133;
        auVar52._8_4_ = fVar168 * fVar139;
        auVar52._12_4_ = fVar170 * fVar149;
        auVar63._0_4_ = fVar161 * fVar56;
        auVar63._4_4_ = fVar166 * fVar12;
        auVar63._8_4_ = fVar168 * fVar13;
        auVar63._12_4_ = fVar170 * fVar14;
        auVar81._0_4_ = fVar150 * fVar160;
        auVar81._4_4_ = fVar154 * fVar165;
        auVar81._8_4_ = fVar155 * fVar167;
        auVar81._12_4_ = fVar156 * fVar169;
        auVar114 = vsubps_avx(auVar63,auVar81);
        auVar103._0_4_ = fVar177 * fVar150;
        auVar103._4_4_ = fVar75 * fVar154;
        auVar103._8_4_ = fVar89 * fVar155;
        auVar103._12_4_ = fVar90 * fVar156;
        auVar115 = vsubps_avx(auVar103,auVar52);
        auVar66 = vandps_avx(auVar81,auVar110);
        auVar69 = vandps_avx(auVar52,auVar110);
        auVar66 = vcmpps_avx(auVar66,auVar69,1);
        auVar114 = vblendvps_avx(auVar115,auVar114,auVar66);
        auVar64._0_4_ = fVar177 * fVar119;
        auVar64._4_4_ = fVar75 * fVar126;
        auVar64._8_4_ = fVar89 * fVar137;
        auVar64._12_4_ = fVar90 * fVar148;
        auVar82._0_4_ = fVar119 * fVar160;
        auVar82._4_4_ = fVar126 * fVar165;
        auVar82._8_4_ = fVar137 * fVar167;
        auVar82._12_4_ = fVar148 * fVar169;
        auVar104._0_4_ = fVar161 * fVar171;
        auVar104._4_4_ = fVar166 * fVar172;
        auVar104._8_4_ = fVar168 * fVar173;
        auVar104._12_4_ = fVar170 * fVar174;
        auVar111._0_4_ = fVar161 * fVar127;
        auVar111._4_4_ = fVar166 * fVar134;
        auVar111._8_4_ = fVar168 * fVar136;
        auVar111._12_4_ = fVar170 * fVar138;
        auVar115 = vsubps_avx(auVar82,auVar104);
        auVar67 = vsubps_avx(auVar111,auVar64);
        auVar66 = vandps_avx(auVar110,auVar104);
        auVar69 = vandps_avx(auVar110,auVar64);
        auVar66 = vcmpps_avx(auVar66,auVar69,1);
        auVar115 = vblendvps_avx(auVar67,auVar115,auVar66);
        local_37a8 = auVar27._0_4_;
        fStack_37a4 = auVar27._4_4_;
        fStack_37a0 = auVar27._8_4_;
        local_37b8 = auVar28._0_4_;
        fStack_37b4 = auVar28._4_4_;
        fStack_37b0 = auVar28._8_4_;
        fVar56 = auVar113._0_4_ * local_37b8 +
                 auVar115._0_4_ * fVar112 + auVar114._0_4_ * local_37a8;
        fVar112 = auVar113._4_4_ * fStack_37b4 +
                  auVar115._4_4_ * fVar121 + auVar114._4_4_ * fStack_37a4;
        fVar119 = auVar113._8_4_ * fStack_37b0 +
                  auVar115._8_4_ * fVar135 + auVar114._8_4_ * fStack_37a0;
        fVar120 = auVar113._12_4_ * fVar23 + auVar115._12_4_ * fVar146 + auVar114._12_4_ * fVar19;
        auVar65._0_4_ = fVar56 + fVar56;
        auVar65._4_4_ = fVar112 + fVar112;
        auVar65._8_4_ = fVar119 + fVar119;
        auVar65._12_4_ = fVar120 + fVar120;
        fVar56 = auVar113._0_4_ * fVar6 + auVar115._0_4_ * fVar5 + auVar114._0_4_ * fVar175;
        fVar112 = auVar113._4_4_ * fVar8 + auVar115._4_4_ * fVar7 + auVar114._4_4_ * fVar181;
        fVar91 = auVar113._8_4_ * fVar93 + auVar115._8_4_ * fVar91 + auVar114._8_4_ * fVar183;
        fVar93 = auVar113._12_4_ * fVar10 + auVar115._12_4_ * fVar9 + auVar114._12_4_ * fVar185;
        auVar66 = vrcpps_avx(auVar65);
        fVar5 = auVar66._0_4_;
        auVar125._0_4_ = auVar65._0_4_ * fVar5;
        fVar6 = auVar66._4_4_;
        auVar125._4_4_ = auVar65._4_4_ * fVar6;
        fVar7 = auVar66._8_4_;
        auVar125._8_4_ = auVar65._8_4_ * fVar7;
        fVar8 = auVar66._12_4_;
        auVar125._12_4_ = auVar65._12_4_ * fVar8;
        auVar132._8_4_ = 0x3f800000;
        auVar132._0_8_ = &DAT_3f8000003f800000;
        auVar132._12_4_ = 0x3f800000;
        auVar66 = vsubps_avx(auVar132,auVar125);
        auVar83._0_4_ = (fVar56 + fVar56) * (fVar5 + fVar5 * auVar66._0_4_);
        auVar83._4_4_ = (fVar112 + fVar112) * (fVar6 + fVar6 * auVar66._4_4_);
        auVar83._8_4_ = (fVar91 + fVar91) * (fVar7 + fVar7 * auVar66._8_4_);
        auVar83._12_4_ = (fVar93 + fVar93) * (fVar8 + fVar8 * auVar66._12_4_);
        auVar66 = vcmpps_avx(auVar83,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar69 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar83,2);
        auVar66 = vandps_avx(auVar69,auVar66);
        auVar69 = ZEXT816(0) << 0x20;
        auVar67 = vcmpps_avx(auVar65,auVar69,4);
        auVar66 = vandps_avx(auVar67,auVar66);
        auVar66 = vpslld_avx(auVar66,0x1f);
        auVar67 = vpsrad_avx(auVar66,0x1f);
        auVar66 = auVar54 & auVar67;
        auVar54 = vandps_avx(auVar54,auVar67);
        if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar66[0xf] < '\0') {
          uStack_37c0 = auVar145._8_8_;
          uStack_35f0 = uStack_37c0;
          local_3658 = auVar115;
          local_3648 = auVar114;
          local_3638 = auVar113;
          local_3628 = auVar83;
          local_3618 = auVar157;
          _local_3608 = auVar124;
          local_35f8 = auVar145._0_8_;
        }
        auVar66 = vpcmpeqd_avx(auVar113,auVar113);
      }
      auVar164 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
      auVar159 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar153 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
      auVar101 = ZEXT1664(auVar66);
      pGVar3 = (context->scene->geometries).items[uVar30].ptr;
      uVar2 = pGVar3->mask;
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar66 = vandps_avx(auVar53,*(undefined1 (*) [16])(ray + 0x90));
      auVar66 = vpcmpeqd_avx(auVar66,auVar69);
      auVar113 = auVar54 & ~auVar66;
      if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          auVar113[0xf] < '\0') {
        auVar54 = vandnps_avx(auVar66,auVar54);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar66 = vandps_avx(local_3618,auVar110);
          auVar113 = vrcpps_avx(local_3618);
          fVar5 = auVar113._0_4_;
          auVar99._0_4_ = local_3618._0_4_ * fVar5;
          fVar6 = auVar113._4_4_;
          auVar99._4_4_ = local_3618._4_4_ * fVar6;
          fVar7 = auVar113._8_4_;
          auVar99._8_4_ = local_3618._8_4_ * fVar7;
          fVar8 = auVar113._12_4_;
          auVar99._12_4_ = local_3618._12_4_ * fVar8;
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = &DAT_3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar113 = vsubps_avx(auVar105,auVar99);
          auVar84._0_4_ = fVar5 + fVar5 * auVar113._0_4_;
          auVar84._4_4_ = fVar6 + fVar6 * auVar113._4_4_;
          auVar84._8_4_ = fVar7 + fVar7 * auVar113._8_4_;
          auVar84._12_4_ = fVar8 + fVar8 * auVar113._12_4_;
          auVar100._8_4_ = 0x219392ef;
          auVar100._0_8_ = 0x219392ef219392ef;
          auVar100._12_4_ = 0x219392ef;
          auVar66 = vcmpps_avx(auVar66,auVar100,5);
          auVar66 = vandps_avx(auVar66,auVar84);
          auVar85._0_4_ = auVar66._0_4_ * (float)local_35f8;
          auVar85._4_4_ = auVar66._4_4_ * local_35f8._4_4_;
          auVar85._8_4_ = auVar66._8_4_ * (float)uStack_35f0;
          auVar85._12_4_ = auVar66._12_4_ * uStack_35f0._4_4_;
          local_3538 = vminps_avx(auVar85,auVar105);
          auVar68._0_4_ = auVar66._0_4_ * (float)local_3608._0_4_;
          auVar68._4_4_ = auVar66._4_4_ * (float)local_3608._4_4_;
          auVar68._8_4_ = auVar66._8_4_ * fStack_3600;
          auVar68._12_4_ = auVar66._12_4_ * fStack_35fc;
          local_3528 = vminps_avx(auVar68,auVar105);
          auVar114 = vpshufd_avx(ZEXT416(uVar30),0);
          local_3518 = vpshufd_avx(ZEXT416(*(uint *)(lVar35 + uVar34 * 4)),0);
          local_3568 = local_3638._0_8_;
          uStack_3560 = local_3638._8_8_;
          local_3558 = local_3648._0_8_;
          uStack_3550 = local_3648._8_8_;
          local_3548 = local_3658;
          vcmpps_avx(ZEXT1632(local_3528),ZEXT1632(local_3528),0xf);
          uStack_34f4 = context->user->instID[0];
          local_34f8 = uStack_34f4;
          uStack_34f0 = uStack_34f4;
          uStack_34ec = uStack_34f4;
          uStack_34e8 = context->user->instPrimID[0];
          uStack_34e4 = uStack_34e8;
          uStack_34e0 = uStack_34e8;
          uStack_34dc = uStack_34e8;
          auVar66 = *(undefined1 (*) [16])(ray + 0x80);
          auVar113 = vblendvps_avx(auVar66,local_3628,auVar54);
          *(undefined1 (*) [16])(ray + 0x80) = auVar113;
          args.valid = (int *)local_3798;
          args.geometryUserPtr = pGVar3->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3568;
          args.N = 4;
          local_3798 = auVar54;
          args.ray = (RTCRayN *)ray;
          local_3508 = auVar114;
          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar3->occlusionFilterN)(&args);
            auVar69 = ZEXT816(0) << 0x40;
            auVar164 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
            auVar153 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
            auVar159 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_3798 == (undefined1  [16])0x0) {
            auVar54 = vpcmpeqd_avx((undefined1  [16])0x0,auVar69);
            auVar69 = vpcmpeqd_avx(auVar114,auVar114);
            auVar101 = ZEXT1664(auVar69);
            auVar54 = auVar54 ^ auVar69;
          }
          else {
            p_Var4 = context->args->filter;
            auVar54 = vpcmpeqd_avx(auVar114,auVar114);
            auVar101 = ZEXT1664(auVar54);
            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var4)(&args);
              auVar69 = ZEXT816(0) << 0x40;
              auVar54 = vpcmpeqd_avx(auVar54,auVar54);
              auVar101 = ZEXT1664(auVar54);
              auVar164 = ZEXT1664(CONCAT412(0x3f800003,CONCAT48(0x3f800003,0x3f8000033f800003)));
              auVar153 = ZEXT1664(CONCAT412(0x3f7ffffa,CONCAT48(0x3f7ffffa,0x3f7ffffa3f7ffffa)));
              auVar159 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar69 = vpcmpeqd_avx(auVar69,local_3798);
            auVar54 = auVar69 ^ auVar101._0_16_;
            auVar86._8_4_ = 0xff800000;
            auVar86._0_8_ = 0xff800000ff800000;
            auVar86._12_4_ = 0xff800000;
            auVar69 = vblendvps_avx(auVar86,*(undefined1 (*) [16])(args.ray + 0x80),auVar69);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar69;
          }
          auVar69 = vpslld_avx(auVar54,0x1f);
          auVar54 = vpsrad_avx(auVar69,0x1f);
          auVar66 = vblendvps_avx(auVar66,*(undefined1 (*) [16])pRVar1,auVar69);
          *(undefined1 (*) [16])pRVar1 = auVar66;
        }
        auVar94 = vpandn_avx(auVar54,auVar94);
      }
      if (((((auVar94 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar94 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar94 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar94[0xf])
         || (bVar40 = 2 < uVar34, uVar34 = uVar34 + 1, bVar40)) break;
    }
    auVar54 = vpand_avx(auVar94,auVar88);
    auVar88 = auVar88 & auVar94;
    if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar88[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar54 ^ auVar101._0_16_);
LAB_00412c81:
  auVar71 = ZEXT1664((undefined1  [16])vVar29.field_0);
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar29.field_0,(undefined1  [16])terminated.field_0);
  auVar88 = auVar101._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar88[0xf]) {
LAB_00412cb7:
    iVar31 = 3;
  }
  else {
    auVar71 = ZEXT1664((undefined1  [16])tray.tfar.field_0);
    auVar87._8_4_ = 0xff800000;
    auVar87._0_8_ = 0xff800000ff800000;
    auVar87._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar87,
                       (undefined1  [16])terminated.field_0);
    iVar31 = 0;
  }
LAB_00412cba:
  if (iVar31 == 3) {
    auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
    auVar70._8_4_ = 0xff800000;
    auVar70._0_8_ = 0xff800000ff800000;
    auVar70._12_4_ = 0xff800000;
    auVar11 = vmaskmovps_avx(auVar11,auVar70);
    *(undefined1 (*) [16])pRVar1 = auVar11;
    return;
  }
  goto LAB_004121cf;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }